

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.cpp
# Opt level: O1

WindyTexture *
pbrt::WindyTexture::Create
          (Transform *renderFromTexture,TextureParameterDictionary *parameters,FileLoc *loc,
          Allocator alloc)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  int iVar17;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  uintptr_t iptr;
  undefined8 *puVar18;
  
  uVar1 = *(undefined8 *)(renderFromTexture->mInv).m[0];
  uVar2 = *(undefined8 *)((renderFromTexture->mInv).m[0] + 2);
  uVar3 = *(undefined8 *)(renderFromTexture->mInv).m[1];
  uVar4 = *(undefined8 *)((renderFromTexture->mInv).m[1] + 2);
  uVar5 = *(undefined8 *)(renderFromTexture->mInv).m[2];
  uVar6 = *(undefined8 *)((renderFromTexture->mInv).m[2] + 2);
  uVar7 = *(undefined8 *)(renderFromTexture->mInv).m[3];
  uVar8 = *(undefined8 *)((renderFromTexture->mInv).m[3] + 2);
  uVar9 = *(undefined8 *)(renderFromTexture->m).m[0];
  uVar10 = *(undefined8 *)((renderFromTexture->m).m[0] + 2);
  uVar11 = *(undefined8 *)(renderFromTexture->m).m[1];
  uVar12 = *(undefined8 *)((renderFromTexture->m).m[1] + 2);
  uVar13 = *(undefined8 *)(renderFromTexture->m).m[2];
  uVar14 = *(undefined8 *)((renderFromTexture->m).m[2] + 2);
  uVar15 = *(undefined8 *)(renderFromTexture->m).m[3];
  uVar16 = *(undefined8 *)((renderFromTexture->m).m[3] + 2);
  iVar17 = (*(alloc.memoryResource)->_vptr_memory_resource[2])(alloc.memoryResource,0x80,4);
  puVar18 = (undefined8 *)CONCAT44(extraout_var,iVar17);
  *puVar18 = uVar1;
  puVar18[1] = uVar2;
  puVar18[2] = uVar3;
  puVar18[3] = uVar4;
  puVar18[4] = uVar5;
  puVar18[5] = uVar6;
  puVar18[6] = uVar7;
  puVar18[7] = uVar8;
  puVar18[8] = uVar9;
  puVar18[9] = uVar10;
  puVar18[10] = uVar11;
  puVar18[0xb] = uVar12;
  puVar18[0xc] = uVar13;
  puVar18[0xd] = uVar14;
  puVar18[0xe] = uVar15;
  puVar18[0xf] = uVar16;
  iVar17 = (*(alloc.memoryResource)->_vptr_memory_resource[2])(alloc.memoryResource,8,8);
  (((WindyTexture *)CONCAT44(extraout_var_00,iVar17))->mapping).
  super_TaggedPointer<pbrt::TransformMapping3D>.bits = (ulong)puVar18 | 0x1000000000000;
  return (WindyTexture *)CONCAT44(extraout_var_00,iVar17);
}

Assistant:

WindyTexture *WindyTexture::Create(const Transform &renderFromTexture,
                                   const TextureParameterDictionary &parameters,
                                   const FileLoc *loc, Allocator alloc) {
    // Initialize 3D texture mapping _map_ from _tp_
    TextureMapping3DHandle map =
        TextureMapping3DHandle::Create(parameters, renderFromTexture, loc, alloc);
    return alloc.new_object<WindyTexture>(map);
}